

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseFailureIncludesDetails::~TestCheckCloseFailureIncludesDetails
          (TestCheckCloseFailureIncludesDetails *this)

{
  TestCheckCloseFailureIncludesDetails *this_local;
  
  ~TestCheckCloseFailureIncludesDetails(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckCloseFailureIncludesDetails)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    TestDetails const details("mytest", "mysuite", "header.h", 10);

    CheckClose(results, 2, 3, 0.01f, details);

    CHECK_EQUAL("mytest", reporter.lastFailedTest);
    CHECK_EQUAL("mysuite", reporter.lastFailedSuite);
    CHECK_EQUAL("header.h", reporter.lastFailedFile);
    CHECK_EQUAL(10, reporter.lastFailedLine);
}